

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * __thiscall Rml::Element::GetElementById(Element *this,String *id)

{
  bool bVar1;
  ElementDocument *local_28;
  Element *search_root;
  String *id_local;
  Element *this_local;
  
  bVar1 = ::std::operator==(id,"#self");
  this_local = this;
  if (!bVar1) {
    bVar1 = ::std::operator==(id,"#document");
    if (bVar1) {
      this_local = &GetOwnerDocument(this)->super_Element;
    }
    else {
      bVar1 = ::std::operator==(id,"#parent");
      if (bVar1) {
        this_local = this->parent;
      }
      else {
        local_28 = GetOwnerDocument(this);
        if (local_28 == (ElementDocument *)0x0) {
          local_28 = (ElementDocument *)this;
        }
        this_local = ElementUtilities::GetElementById(&local_28->super_Element,id);
      }
    }
  }
  return this_local;
}

Assistant:

Element* Element::GetElementById(const String& id)
{
	// Check for special-case tokens.
	if (id == "#self")
		return this;
	else if (id == "#document")
		return GetOwnerDocument();
	else if (id == "#parent")
		return this->parent;
	else
	{
		Element* search_root = GetOwnerDocument();
		if (search_root == nullptr)
			search_root = this;
		return ElementUtilities::GetElementById(search_root, id);
	}
}